

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

int polyroot(double *coeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  size_t __size;
  double dVar1;
  int iVar2;
  double *OPR;
  double *OPI;
  double *pdVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)DEGREE;
  __size = lVar5 * 8 + 8;
  OPR = (double *)malloc(__size);
  OPI = (double *)malloc(__size);
  pdVar3 = coeff + lVar5;
  for (lVar4 = 0; lVar4 <= lVar5; lVar4 = lVar4 + 1) {
    dVar1 = *pdVar3;
    OPI[lVar4] = 0.0;
    OPR[lVar4] = dVar1;
    pdVar3 = pdVar3 + -1;
  }
  iVar2 = cpoly(OPR,OPI,DEGREE,ZEROR,ZEROI);
  free(OPR);
  free(OPI);
  return iVar2;
}

Assistant:

int polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - coeff[0] + coeff[1] * x^1 + coeff[2] * x^2 + ---- + coeff[DEGREE+1] * x^DEGREE 

	The program fails if there are leading zeros. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail,i,N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = coeff[N - 1 - i];
		OPI[i] = 0.0;
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}